

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::base_sink<std::mutex>::set_formatter
          (base_sink<std::mutex> *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *sink_formatter)

{
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *sink_formatter_local;
  base_sink<std::mutex> *this_local;
  
  lock._M_device = (mutex_type *)sink_formatter;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::unique_ptr
            (&local_28,sink_formatter);
  (*(this->super_sink)._vptr_sink[9])(this,&local_28);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&local_28);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void set_formatter(std::unique_ptr<spdlog::formatter> sink_formatter) final
    {
        std::lock_guard<Mutex> lock(mutex_);
        set_formatter_(std::move(sink_formatter));
    }